

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> __thiscall
duckdb::CopyDatabaseInfo::Deserialize(CopyDatabaseInfo *this,Deserializer *deserializer)

{
  CopyDatabaseInfo *this_00;
  pointer pCVar1;
  _Head_base<0UL,_duckdb::CopyDatabaseInfo_*,_false> local_20;
  
  this_00 = (CopyDatabaseInfo *)operator_new(0x48);
  CopyDatabaseInfo(this_00);
  local_20._M_head_impl = this_00;
  pCVar1 = unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>,_true>
           ::operator->((unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,200,"target_database",&pCVar1->target_database);
  pCVar1 = unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>,_true>
           ::operator->((unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>,_true>
                         *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>,true>>
            (deserializer,0xc9,"entries",&pCVar1->entries);
  (this->super_ParseInfo)._vptr_ParseInfo = (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
         (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)this;
}

Assistant:

unique_ptr<ParseInfo> CopyDatabaseInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<CopyDatabaseInfo>(new CopyDatabaseInfo());
	deserializer.ReadPropertyWithDefault<string>(200, "target_database", result->target_database);
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<CreateInfo>>>(201, "entries", result->entries);
	return std::move(result);
}